

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

OpResult __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,bool owned,CordRep *edge,size_t delta)

{
  size_t sVar1;
  OpResult OVar2;
  OpResult OVar3;
  size_t delta_local;
  CordRep *edge_local;
  bool owned_local;
  CordRepBtree *this_local;
  OpResult result;
  
  sVar1 = size(this);
  if (sVar1 < 6) {
    OVar2 = ToOpResult(this,owned);
    this_local = OVar2.tree;
    result.tree._0_4_ = OVar2.action;
    Add<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>(this_local,edge);
    (this_local->super_CordRep).length = delta + (this_local->super_CordRep).length;
  }
  else {
    this_local = New(edge);
    result.tree._0_4_ = kPopped;
  }
  OVar3.action = (Action)result.tree;
  OVar3.tree = this_local;
  OVar3._12_4_ = 0;
  return OVar3;
}

Assistant:

inline OpResult CordRepBtree::AddEdge(bool owned, CordRep* edge, size_t delta) {
  if (size() >= kMaxCapacity) return {New(edge), kPopped};
  OpResult result = ToOpResult(owned);
  result.tree->Add<edge_type>(edge);
  result.tree->length += delta;
  return result;
}